

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

SequenceMatchListSyntax * __thiscall
slang::parsing::Parser::parseSequenceMatchList(Parser *this,Token *closeParen)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  PropertyExprSyntax *pPVar4;
  undefined4 extraout_var;
  SequenceMatchListSyntax *pSVar5;
  Info *src;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  TokenKind TVar6;
  ulong uVar7;
  Token TVar8;
  Token TVar9;
  Token comma;
  Token local_200;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f0;
  undefined1 local_1e0;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if (!bVar1) {
    TVar8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    *closeParen = TVar8;
    return (SequenceMatchListSyntax *)0x0;
  }
  Token::Token(&local_1d8);
  local_1d8 = ParserBase::expect(&this->super_ParserBase,Comma);
  if ((local_1d8._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&local_1d8);
    TVar8 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    *closeParen = TVar8;
    auStack_1b0._16_8_ = (pointer)0x0;
    auStack_1b0._8_8_ = (Info *)0x0;
    goto LAB_003b1518;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  local_200 = TVar8;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_200);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
LAB_003b134a:
    TVar8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    src = TVar8.info;
    *closeParen = TVar8;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleArgument(TVar8.kind);
    if (bVar1) {
      while( true ) {
        pPVar4 = parsePropertyExpr(this,0);
        local_1f0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
        local_1e0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
        if (TVar6 == EndOfFile || bVar1) break;
        if (TVar6 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleArgument,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,false);
            if (!bVar1) goto LAB_003b134a;
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_1f0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1e0 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
        if (TVar6 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar8.info == TVar9.info && TVar8.kind == TVar6) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleArgument,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
        uVar7 = TVar9._0_8_ & 0xffffffff;
        TVar8.info = TVar9.info;
        TVar8.kind = (short)uVar7;
        TVar8._2_1_ = (char)(uVar7 >> 0x10);
        TVar8.numFlags.raw = (char)(uVar7 >> 0x18);
        TVar8.rawLen = (int)(uVar7 >> 0x20);
        local_200 = TVar9;
      }
      goto LAB_003b134a;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar8,CloseParenthesis,closeParen,(DiagCode)0x10001);
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  auStack_1b0._8_8_ = extraout_RDX_00;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_003b1518:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_005dc1e8;
  local_198._M_extent_value = auStack_1b0._8_8_;
  pSVar5 = slang::syntax::SyntaxFactory::sequenceMatchList
                     (&this->factory,local_1d8,
                      (SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)local_1c8);
  return pSVar5;
}

Assistant:

SequenceMatchListSyntax* Parser::parseSequenceMatchList(Token& closeParen) {
    if (!peek(TokenKind::Comma)) {
        closeParen = expect(TokenKind::CloseParenthesis);
        return nullptr;
    }

    Token comma;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleArgument, isEndOfParenList>(TokenKind::Comma, TokenKind::CloseParenthesis,
                                                    TokenKind::Comma, comma, list, closeParen,
                                                    RequireItems::True, diag::ExpectedExpression,
                                                    [this] { return &parsePropertyExpr(0); });

    return &factory.sequenceMatchList(comma, list);
}